

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void Encode(uchar *output,UINT4 *input,uint len)

{
  uint local_24;
  uint local_20;
  uint j;
  uint i;
  uint len_local;
  UINT4 *input_local;
  uchar *output_local;
  
  local_20 = 0;
  for (local_24 = 0; local_24 < len; local_24 = local_24 + 4) {
    output[local_24] = (uchar)input[local_20];
    output[local_24 + 1] = (uchar)(input[local_20] >> 8);
    output[local_24 + 2] = (uchar)(input[local_20] >> 0x10);
    output[local_24 + 3] = (uchar)(input[local_20] >> 0x18);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

static void Encode (unsigned char *output,
                    UINT4 *input,
                    unsigned int len)
{
  unsigned int i, j;

  for(i = 0, j = 0; j < len; i++, j += 4) {
    output[j] = (unsigned char)(input[i] & 0xff);
    output[j+1] = (unsigned char)((input[i] >> 8) & 0xff);
    output[j+2] = (unsigned char)((input[i] >> 16) & 0xff);
    output[j+3] = (unsigned char)((input[i] >> 24) & 0xff);
  }
}